

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void __thiscall CVmImageFileMem::copy_data(CVmImageFileMem *this,char *buf,size_t len)

{
  if (this->pos_ + len <= this->len_) {
    memcpy(buf,this->mem_ + this->pos_,len);
    this->pos_ = this->pos_ + len;
    return;
  }
  err_throw(0x12f);
}

Assistant:

void CVmImageFileMem::copy_data(char *buf, size_t len)
{
    /* if we're past the end of the file, throw an error */
    if (pos_ + len > len_)
        err_throw(VMERR_READ_PAST_IMG_END);

    /* copy data into the caller's buffer */
    memcpy(buf, mem_ + pos_, len);

    /* seek past the data */
    pos_ += len;
}